

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_state_callback_add(callback_type_e c_type,_func_void_void_ptr *func,void *arg)

{
  callback_collection_s *pcVar1;
  fio_lock_i fVar2;
  fio_ls_embd_s *pfVar3;
  ulong uVar4;
  fio_ls_embd_s *pfVar5;
  int *piVar6;
  fio_lock_i ret;
  timespec local_38;
  
  if ((c_type == FIO_CALL_ON_INITIALIZE) && (fio_data != (fio_data_s *)0x0)) {
    (*func)(arg);
    return;
  }
  if (c_type < (FIO_CALL_AT_EXIT|FIO_CALL_BEFORE_FORK) && func != (_func_void_void_ptr *)0x0) {
    uVar4 = (ulong)c_type;
    pcVar1 = callback_collection + uVar4;
    LOCK();
    fVar2 = pcVar1->lock;
    pcVar1->lock = '\x01';
    UNLOCK();
    local_38.tv_sec = CONCAT71(local_38.tv_sec._1_7_,fVar2);
    while (fVar2 != '\0') {
      local_38.tv_sec = 0;
      local_38.tv_nsec = 1;
      nanosleep(&local_38,(timespec *)0x0);
      LOCK();
      fVar2 = pcVar1->lock;
      pcVar1->lock = '\x01';
      UNLOCK();
      local_38.tv_sec = CONCAT71(local_38.tv_sec._1_7_,fVar2);
    }
    if (callback_collection[uVar4].callbacks.next == (fio_ls_embd_s *)0x0) {
      pfVar5 = (fio_ls_embd_s *)(uVar4 * 0x18 + 0x18c9e8);
      callback_collection[uVar4].callbacks.prev = pfVar5;
      callback_collection[uVar4].callbacks.next = pfVar5;
    }
    pfVar5 = (fio_ls_embd_s *)malloc(0x20);
    if (pfVar5 == (fio_ls_embd_s *)0x0) {
      if (0 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR(
                      "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:3334"
                      );
      }
      kill(0,2);
      piVar6 = __errno_location();
      exit(*piVar6);
    }
    pfVar5[1].prev = (fio_ls_embd_s *)func;
    pfVar5[1].next = (fio_ls_embd_s *)arg;
    pfVar3 = callback_collection[uVar4].callbacks.prev;
    pfVar5->prev = pfVar3;
    pfVar5->next = (fio_ls_embd_s *)(uVar4 * 0x18 + 0x18c9e8);
    pfVar3->next = pfVar5;
    callback_collection[uVar4].callbacks.prev = pfVar5;
    LOCK();
    pcVar1->lock = '\0';
    UNLOCK();
  }
  return;
}

Assistant:

void fio_state_callback_add(callback_type_e c_type, void (*func)(void *),
                            void *arg) {
  if (c_type == FIO_CALL_ON_INITIALIZE && fio_data) {
    func(arg);
    return;
  }
  if (!func || (int)c_type < 0 || c_type > FIO_CALL_NEVER)
    return;
  fio_lock(&callback_collection[c_type].lock);
  fio_state_callback_ensure(&callback_collection[c_type]);
  callback_data_s *tmp = malloc(sizeof(*tmp));
  FIO_ASSERT_ALLOC(tmp);
  *tmp = (callback_data_s){.func = func, .arg = arg};
  fio_ls_embd_push(&callback_collection[c_type].callbacks, &tmp->node);
  fio_unlock(&callback_collection[c_type].lock);
}